

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O0

string * __thiscall CBlock::ToString_abi_cxx11_(CBlock *this)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<const_CTransaction> *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  stringstream s;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  base_blob<256U> *in_stack_fffffffffffffcf0;
  size_type *this_00;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  *__lhs;
  CBlockHeader *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fmt;
  CTransaction *this_01;
  string local_250 [160];
  string local_1b0 [32];
  stringstream local_190 [16];
  CTransaction local_180;
  uint *in_stack_ffffffffffffff00;
  uint *in_stack_ffffffffffffff08;
  uint *in_stack_ffffffffffffff10;
  unsigned_long *in_stack_ffffffffffffff18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args = in_RDI;
  std::__cxx11::stringstream::stringstream(local_190);
  this_01 = &local_180;
  CBlockHeader::GetHash(in_stack_fffffffffffffd08);
  base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffcf0);
  fmt = in_RSI;
  base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffcf0);
  base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffcf0);
  args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&fmt[2]._M_dataplus._M_p + 4);
  this_00 = &fmt[2]._M_string_length;
  __lhs = (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
           *)((long)&fmt[2]._M_string_length + 4);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::size(in_stack_fffffffffffffce8);
  tinyformat::
  format<std::__cxx11::string,int,std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_int,unsigned_int,unsigned_long>
            ((char *)fmt,args,(int *)in_RDI,in_RSI,args_3,in_stack_ffffffffffffff00,
             in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  std::operator<<((ostream *)this_01,local_1b0);
  std::__cxx11::string::~string(args_3);
  std::__cxx11::string::~string(args_3);
  std::__cxx11::string::~string(args_3);
  std::__cxx11::string::~string(args_3);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)this_00);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)this_00);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                      (__lhs,(__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                              *)this_00);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)args_3);
    poVar3 = std::operator<<((ostream *)&local_180,"  ");
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               args_3);
    CTransaction::ToString_abi_cxx11_(this_01);
    poVar3 = std::operator<<(poVar3,local_250);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(args_3);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)args_3);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return args;
  }
  __stack_chk_fail();
}

Assistant:

std::string CBlock::ToString() const
{
    std::stringstream s;
    s << strprintf("CBlock(hash=%s, ver=0x%08x, hashPrevBlock=%s, hashMerkleRoot=%s, nTime=%u, nBits=%08x, nNonce=%u, vtx=%u)\n",
        GetHash().ToString(),
        nVersion,
        hashPrevBlock.ToString(),
        hashMerkleRoot.ToString(),
        nTime, nBits, nNonce,
        vtx.size());
    for (const auto& tx : vtx) {
        s << "  " << tx->ToString() << "\n";
    }
    return s.str();
}